

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::GUIDTest_test_new_guid_differ_Test::TestBody
          (GUIDTest_test_new_guid_differ_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  AssertionResult gtest_ar;
  GUID guid5;
  GUID guid4;
  GUID guid3;
  GUID guid2;
  GUID guid1;
  GUID guid0;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  GUID local_90 [16];
  GUID local_80 [16];
  GUID local_70 [16];
  GUID local_60 [16];
  GUID local_50 [16];
  GUID local_40 [16];
  
  iVar5 = 999;
  do {
    bidfx_public_api::tools::GUID::GUID(local_40);
    bidfx_public_api::tools::GUID::GUID(local_50);
    bidfx_public_api::tools::GUID::GUID(local_60);
    bidfx_public_api::tools::GUID::GUID(local_70);
    bidfx_public_api::tools::GUID::GUID(local_80);
    bidfx_public_api::tools::GUID::GUID(local_90);
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
    testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
              (local_e0,"guid0.ToString()","guid1.ToString()",&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      pcVar3 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                 ,0x21,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)local_d0._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001e028a:
      bVar4 = 1;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                (local_e0,"guid0.ToString()","guid2.ToString()",&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        pcVar3 = "";
        if (local_d8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_d8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x22,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_d0._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_001e028a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                (local_e0,"guid0.ToString()","guid3.ToString()",&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        pcVar3 = "";
        if (local_d8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_d8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x23,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_d0._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_001e028a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                (local_e0,"guid0.ToString()","guid4.ToString()",&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        pcVar3 = "";
        if (local_d8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_d8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x24,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_d0._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_001e028a;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      bidfx_public_api::tools::GUID::ToString_abi_cxx11_();
      testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                (local_e0,"guid0.ToString()","guid5.ToString()",&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      iVar1 = local_e0[0];
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        pcVar3 = "";
        if (local_d8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_d8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/guid_test.cpp"
                   ,0x25,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_d0._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bVar4 = (byte)iVar1 ^ 1;
    }
    bidfx_public_api::tools::GUID::~GUID(local_90);
    bidfx_public_api::tools::GUID::~GUID(local_80);
    bidfx_public_api::tools::GUID::~GUID(local_70);
    bidfx_public_api::tools::GUID::~GUID(local_60);
    bidfx_public_api::tools::GUID::~GUID(local_50);
    bidfx_public_api::tools::GUID::~GUID(local_40);
    bVar2 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if ((bVar4 != 0) || (bVar2)) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(GUIDTest, test_new_guid_differ)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid0;
        GUID guid1;
        GUID guid2;
        GUID guid3;
        GUID guid4;
        GUID guid5;
        ASSERT_NE(guid0.ToString(), guid1.ToString());
        ASSERT_NE(guid0.ToString(), guid2.ToString());
        ASSERT_NE(guid0.ToString(), guid3.ToString());
        ASSERT_NE(guid0.ToString(), guid4.ToString());
        ASSERT_NE(guid0.ToString(), guid5.ToString());
    }
}